

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O3

string * __thiscall
Vault::Base64::encode_abi_cxx11_
          (string *__return_storage_ptr__,Base64 *this,uchar *bytes_to_encode,uint in_len)

{
  undefined4 in_register_0000000c;
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  long lVar8;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  string base64_chars;
  undefined2 local_58;
  byte local_56;
  undefined4 local_54;
  long *local_50 [2];
  long local_40 [2];
  ulong uVar7;
  
  uVar3 = (ulong)bytes_to_encode & 0xffffffff;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",
             "",CONCAT44(in_register_0000000c,in_len));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_56 = 0;
  local_58 = 0;
  local_54 = 0;
  uVar4 = 0;
  if ((int)bytes_to_encode != 0) {
    do {
      uVar6 = (int)uVar4 + 1;
      uVar7 = (ulong)uVar6;
      *(Base64 *)((long)&local_58 + uVar4) = *this;
      cVar5 = (char)__return_storage_ptr__;
      if (uVar6 == 3) {
        local_54._0_2_ =
             CONCAT11(((byte)local_58 & 3) << 4 | local_58._1_1_ >> 4,(byte)local_58 >> 2);
        local_54._0_3_ = CONCAT12((local_58._1_1_ & 0xf) << 2 | local_56 >> 6,(undefined2)local_54);
        local_54 = CONCAT13(local_56,(undefined3)local_54) & 0x3fffffff;
        lVar8 = 0;
        do {
          std::__cxx11::string::push_back(cVar5);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        uVar7 = 0;
      }
      uVar6 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar6;
      this = this + 1;
      uVar4 = uVar7;
    } while (uVar6 != 0);
    iVar2 = (int)uVar7;
    if (iVar2 != 0) {
      if (iVar2 < 3) {
        memset((void *)((long)&local_58 + uVar7),0,(ulong)(2 - iVar2) + 1);
      }
      local_54._0_2_ = CONCAT11(((byte)local_58 & 3) << 4 | local_58._1_1_ >> 4,(byte)local_58 >> 2)
      ;
      local_54._0_3_ = CONCAT12((local_58._1_1_ & 0xf) << 2 | local_56 >> 6,(undefined2)local_54);
      local_54 = CONCAT13(local_56,(undefined3)local_54) & 0x3fffffff;
      if (-1 < iVar2) {
        uVar4 = 0;
        do {
          std::__cxx11::string::push_back(cVar5);
          uVar4 = uVar4 + 1;
        } while (iVar2 + 1 != uVar4);
      }
      iVar1 = 3;
      if (3 < iVar2) {
        iVar1 = iVar2;
      }
      iVar2 = (iVar1 - iVar2) + 1;
      while (iVar2 = iVar2 + -1, iVar2 != 0) {
        std::__cxx11::string::push_back(cVar5);
      }
    }
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Vault::Base64::encode(unsigned char const *bytes_to_encode,
                                  unsigned int in_len) {
  std::string base64_chars =
      "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
  std::string ret;
  int i = 0;
  int j = 0;
  unsigned char char_array_3[3] = {0};
  unsigned char char_array_4[4] = {0};

  while (in_len--) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] =
          ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] =
          ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for (i = 0; (i < 4); i++) {
        ret += base64_chars[char_array_4[i]];
      }

      i = 0;
    }
  }

  if (i) {
    for (j = i; j < 3; j++) {
      char_array_3[j] = '\0';
    }

    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] =
        ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] =
        ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;

    for (j = 0; (j < i + 1); j++) {
      ret += base64_chars[char_array_4[j]];
    }

    while ((i++ < 3)) {
      ret += '=';
    }
  }

  return ret;
}